

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

FloatImage * __thiscall nv::FloatImage::fastDownSample(FloatImage *this)

{
  ulong uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  ushort uVar4;
  ushort uVar5;
  uint32 uVar6;
  uint uVar7;
  float *pfVar8;
  uint uVar9;
  FloatImage *pFVar10;
  float *pfVar11;
  float *pfVar12;
  ulong uVar13;
  ulong uVar14;
  float *pfVar15;
  float *pfVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  uint y_1;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  uint y;
  uint uVar27;
  long lVar28;
  ushort uVar29;
  ushort uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  ushort local_58;
  ushort uStack_56;
  
  pFVar10 = (FloatImage *)operator_new(0x20);
  pFVar10->_vptr_FloatImage = (_func_int **)&PTR__FloatImage_0024e850;
  pFVar10->m_mem = (float *)0x0;
  pFVar10->m_width = 0;
  pFVar10->m_height = 0;
  pFVar10->m_componentNum = 0;
  pFVar10->m_count = 0;
  uVar2 = this->m_width;
  uVar3 = this->m_height;
  uVar6 = this->m_componentNum;
  mem::free((void *)0x0);
  uVar29 = ((ushort)uVar2 >> 1) + (ushort)((ushort)uVar2 >> 1 == 0);
  uVar30 = ((ushort)uVar3 >> 1) + (ushort)((ushort)uVar3 >> 1 == 0);
  uVar7 = (uint)uVar29;
  uVar17 = (uint)uVar30;
  pFVar10->m_mem = (float *)0x0;
  pFVar10->m_width = uVar29;
  pFVar10->m_height = uVar30;
  pFVar10->m_componentNum = uVar6;
  uVar25 = (uint)uVar30 * (uint)uVar29;
  uVar27 = uVar6 * uVar25;
  pFVar10->m_count = uVar27;
  pfVar11 = (float *)mem::malloc((ulong)uVar27 << 2);
  pFVar10->m_mem = pfVar11;
  uVar4 = this->m_width;
  uVar5 = this->m_height;
  uVar27 = (uint)uVar4;
  if (uVar5 == 1 || uVar4 == 1) {
    uVar27 = uVar5 * uVar27;
    if ((uVar27 & 1) == 0) {
      uVar7 = this->m_componentNum;
      if ((ulong)uVar7 != 0) {
        pfVar8 = this->m_mem;
        uVar17 = 0;
        uVar18 = 0;
        uVar21 = 0;
        do {
          lVar23 = 0;
          do {
            pfVar11[(ulong)uVar17 + lVar23] =
                 (pfVar8[(ulong)uVar18 + lVar23 * 2] + pfVar8[(ulong)uVar18 + lVar23 * 2 + 1]) * 0.5
            ;
            lVar23 = lVar23 + 1;
          } while (uVar25 != (uint)lVar23);
          uVar21 = uVar21 + 1;
          uVar18 = uVar18 + uVar27;
          uVar17 = uVar17 + uVar25;
        } while (uVar21 != uVar7);
      }
    }
    else {
      uVar7 = this->m_componentNum;
      if ((ulong)uVar7 != 0) {
        pfVar8 = this->m_mem;
        uVar17 = 0;
        uVar13 = 0;
        uVar21 = 0;
        do {
          lVar23 = 0;
          uVar18 = uVar25;
          do {
            uVar22 = (uint)(lVar23 + 1);
            pfVar11[(ulong)uVar17 + lVar23] =
                 ((float)(int)uVar22 * pfVar8[uVar13 + lVar23 * 2 + 2] +
                 (float)uVar18 * pfVar8[uVar13 + lVar23 * 2] +
                 pfVar8[uVar13 + lVar23 * 2 + 1] * (float)(int)uVar25) *
                 (1.0 / (float)(int)(uVar25 * 2 + 1));
            uVar18 = uVar18 - 1;
            lVar23 = lVar23 + 1;
          } while (uVar22 != uVar25);
          uVar21 = uVar21 + 1;
          uVar13 = (ulong)((int)uVar13 + uVar27);
          uVar17 = uVar17 + uVar25;
        } while (uVar21 != uVar7);
      }
    }
  }
  else if (((uVar5 | uVar4) & 1) == 0) {
    uVar18 = this->m_componentNum;
    if ((ulong)uVar18 != 0) {
      pfVar8 = this->m_mem;
      uVar21 = 0;
      do {
        pfVar12 = pfVar11 + uVar25 * (int)uVar21;
        uVar22 = 0;
        pfVar16 = pfVar8 + uVar5 * uVar27 * (int)uVar21;
        do {
          pfVar15 = pfVar16 + uVar4;
          lVar23 = 0;
          lVar28 = 0;
          do {
            pfVar12[lVar28] =
                 (pfVar16[lVar28 * 2] + pfVar16[lVar28 * 2 + 1] + *pfVar15 + pfVar15[1]) * 0.25;
            pfVar15 = pfVar15 + 2;
            lVar28 = lVar28 + 1;
            lVar23 = lVar23 + -4;
          } while (uVar7 != (uint)lVar28);
          uVar22 = uVar22 + 1;
          pfVar12 = (float *)((long)pfVar12 - lVar23);
          pfVar16 = pfVar15;
        } while (uVar22 != uVar17);
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar18);
    }
  }
  else {
    uVar18 = (uint)uVar5;
    if ((uVar4 & 1) == 0) {
      if (((uVar5 & 1) != 0) && (uVar22 = this->m_componentNum, (ulong)uVar22 != 0)) {
        pfVar8 = this->m_mem;
        uVar21 = (ulong)((uint)uVar4 * 8);
        uVar13 = 0;
        uVar26 = 0;
        do {
          pfVar12 = pfVar8 + (ulong)uVar4 + uVar13 + 1;
          lVar23 = (long)pfVar8 + uVar13 * 4 + uVar21 + 4;
          pfVar16 = pfVar8 + uVar27 * uVar18 * (int)uVar26;
          pfVar15 = pfVar11 + uVar25 * (int)uVar26;
          uVar19 = 0;
          do {
            uVar9 = uVar17 - uVar19;
            uVar19 = uVar19 + 1;
            lVar28 = 0;
            uVar24 = (ulong)uVar7;
            do {
              *(float *)((long)pfVar15 + lVar28) =
                   ((*(float *)(lVar23 + -4 + lVar28 * 2) + *(float *)(lVar23 + lVar28 * 2)) *
                    (float)(int)uVar19 +
                   (*(float *)((long)pfVar12 + lVar28 * 2 + -4) +
                   *(float *)((long)pfVar12 + lVar28 * 2)) * (float)(int)(short)uVar30 +
                   (*(float *)((long)pfVar16 + lVar28 * 2) +
                   *(float *)((long)pfVar16 + lVar28 * 2 + 4)) * (float)uVar9 + 0.0) *
                   (1.0 / (float)((uint)uVar5 + (uint)uVar5));
              lVar28 = lVar28 + 4;
              uVar24 = uVar24 - 1;
            } while (uVar24 != 0);
            pfVar16 = (float *)((long)pfVar16 + uVar21);
            pfVar12 = (float *)((long)pfVar12 + uVar21);
            lVar23 = lVar23 + uVar21;
            pfVar15 = (float *)((long)pfVar15 + lVar28);
          } while (uVar19 != uVar17);
          uVar26 = uVar26 + 1;
          uVar13 = (ulong)((int)uVar13 + uVar27 * uVar18);
        } while (uVar26 != uVar22);
      }
    }
    else {
      uVar21 = (ulong)this->m_componentNum;
      if ((uVar5 & 1) == 0) {
        if (uVar21 != 0) {
          pfVar8 = this->m_mem;
          iVar20 = uVar18 * uVar4;
          uVar13 = 0;
          uVar26 = 0;
          do {
            pfVar12 = pfVar8 + (ulong)uVar4 + uVar13 + 2;
            pfVar16 = pfVar8 + (uint)(iVar20 * (int)uVar26);
            pfVar15 = pfVar11 + uVar25 * (int)uVar26;
            uVar27 = 0;
            do {
              lVar23 = 0;
              uVar24 = 0;
              uVar18 = uVar7;
              do {
                uVar14 = uVar24 + 1;
                pfVar15[uVar24] =
                     ((pfVar16[uVar24 * 2 + 2] + pfVar12[uVar24 * 2]) * (float)(uVar14 & 0xffffffff)
                     + (pfVar16[uVar24 * 2 + 1] + pfVar12[uVar24 * 2 + -1]) *
                       (float)(int)(short)uVar29 +
                       (pfVar16[uVar24 * 2] + pfVar12[uVar24 * 2 + -2]) * (float)uVar18 + 0.0) *
                     (1.0 / (float)((uint)uVar4 + (uint)uVar4));
                uVar18 = uVar18 - 1;
                lVar23 = lVar23 + -4;
                uVar24 = uVar14;
              } while (uVar7 != uVar14);
              pfVar16 = (float *)((long)pfVar16 + (ulong)((uint)uVar4 * 8));
              uVar27 = uVar27 + 1;
              pfVar12 = (float *)((long)pfVar12 + (ulong)((uint)uVar4 * 8));
              pfVar15 = (float *)((long)pfVar15 - lVar23);
            } while (uVar27 != uVar17);
            uVar26 = uVar26 + 1;
            uVar13 = (ulong)(uint)((int)uVar13 + iVar20);
          } while (uVar26 != uVar21);
        }
      }
      else if (uVar21 != 0) {
        iVar20 = uVar18 * uVar4;
        fVar31 = (float)(int)(short)uVar29;
        pfVar8 = this->m_mem;
        uVar26 = (ulong)((uint)uVar4 * 8);
        uVar13 = 0;
        uVar24 = 0;
        do {
          pfVar12 = pfVar8 + (ulong)uVar4 + uVar13 + 1;
          lVar23 = (long)pfVar8 + uVar13 * 4 + uVar26 + 4;
          pfVar16 = pfVar8 + (uint)(iVar20 * (int)uVar24);
          pfVar15 = pfVar11 + uVar25 * (int)uVar24;
          uVar27 = 0;
          do {
            uVar22 = uVar30 - uVar27;
            uVar27 = uVar27 + 1;
            lVar28 = 0;
            uVar14 = 0;
            uVar18 = uVar7;
            do {
              fVar32 = (float)uVar18;
              uVar1 = uVar14 + 1;
              fVar33 = (float)(uVar1 & 0xffffffff) * pfVar16[uVar14 * 2 + 2];
              pfVar15[uVar14] =
                   ((fVar32 * *(float *)(lVar23 + -4 + uVar14 * 8) +
                     *(float *)(lVar23 + uVar14 * 8) * fVar31 + fVar33) * (float)(int)uVar27 +
                   (pfVar12[uVar14 * 2 + -1] * fVar32 + pfVar12[uVar14 * 2] * fVar31 + fVar33) *
                   (float)(int)(short)uVar30 +
                   (pfVar16[uVar14 * 2] * fVar32 + pfVar16[uVar14 * 2 + 1] * fVar31 + fVar33) *
                   (float)uVar22 + 0.0) * (1.0 / (float)iVar20);
              uVar18 = uVar18 - 1;
              lVar28 = lVar28 + -4;
              uVar14 = uVar1;
            } while ((uint)uVar29 != uVar1);
            pfVar16 = (float *)((long)pfVar16 + uVar26);
            pfVar12 = (float *)((long)pfVar12 + uVar26);
            lVar23 = lVar23 + uVar26;
            pfVar15 = (float *)((long)pfVar15 - lVar28);
          } while (uVar27 != uVar17);
          uVar24 = uVar24 + 1;
          uVar13 = (ulong)(uint)((int)uVar13 + iVar20);
        } while (uVar24 != uVar21);
      }
    }
  }
  return pFVar10;
}

Assistant:

FloatImage * FloatImage::fastDownSample() const
{
	nvDebugCheck(m_width != 1 || m_height != 1);
	
	AutoPtr<FloatImage> dst_image( new FloatImage() );

	const uint w = max(1, m_width / 2);
	const uint h = max(1, m_height / 2);
	dst_image->allocate(m_componentNum, w, h);

	// 1D box filter.
	if (m_width == 1 || m_height == 1)
	{
		const uint n = w * h;
		
		if ((m_width * m_height) & 1)
		{
			const float scale = 1.0f / (2 * n + 1);
			
			for(uint c = 0; c < m_componentNum; c++)
			{
				const float * src = this->channel(c);
				float * dst = dst_image->channel(c);
				
				for(uint x = 0; x < n; x++)
				{
					const float w0 = float(n - x);
					const float w1 = float(n - 0);
					const float w2 = float(1 + x);
					
					*dst++ = scale * (w0 * src[0] + w1 * src[1] + w2 * src[2]);
					src += 2;
				}
			}
		}
		else
		{
			for(uint c = 0; c < m_componentNum; c++)
			{
				const float * src = this->channel(c);
				float * dst = dst_image->channel(c);
				
				for(uint x = 0; x < n; x++)
				{
					*dst = 0.5f * (src[0] + src[1]);
					dst++;
					src += 2;
				}
			}
		}
	}
	
	// Regular box filter.
	else if ((m_width & 1) == 0 && (m_height & 1) == 0)
	{
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				for(uint x = 0; x < w; x++)
				{
					*dst = 0.25f * (src[0] + src[1] + src[m_width] + src[m_width + 1]);
					dst++;
					src += 2;
				}
				
				src += m_width;
			}
		}
	}
	
	// Polyphase filters.
	else if (m_width & 1 && m_height & 1)
	{
		nvDebugCheck(m_width == 2 * w + 1);
		nvDebugCheck(m_height == 2 * h + 1);
		
		const float scale = 1.0f / (m_width * m_height);
		
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				const float v0 = float(h - y);
				const float v1 = float(h - 0);
				const float v2 = float(1 + y);
				
				for (uint x = 0; x < w; x++)
				{
					const float w0 = float(w - x);
					const float w1 = float(w - 0);
					const float w2 = float(1 + x);
					
					float f = 0.0f;
					f += v0 * (w0 * src[0 * m_width + 2 * x] + w1 * src[0 * m_width + 2 * x + 1] + w2 * src[0 * m_width + 2 * x + 2]);
					f += v1 * (w0 * src[1 * m_width + 2 * x] + w1 * src[1 * m_width + 2 * x + 1] + w2 * src[0 * m_width + 2 * x + 2]);
					f += v2 * (w0 * src[2 * m_width + 2 * x] + w1 * src[2 * m_width + 2 * x + 1] + w2 * src[0 * m_width + 2 * x + 2]);
					
					*dst = f * scale;
					dst++;
				}
				
				src += 2 * m_width;
			}
		}
	}
	else if (m_width & 1)
	{
		nvDebugCheck(m_width == 2 * w + 1);
		const float scale = 1.0f / (2 * m_width);
		
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				for (uint x = 0; x < w; x++)
				{
					const float w0 = float(w - x);
					const float w1 = float(w - 0);
					const float w2 = float(1 + x);
					
					float f = 0.0f;
					f += w0 * (src[2 * x + 0] + src[m_width + 2 * x + 0]);
					f += w1 * (src[2 * x + 1] + src[m_width + 2 * x + 1]);
					f += w2 * (src[2 * x + 2] + src[m_width + 2 * x + 2]);
					
					*dst = f * scale;
					dst++;
				}
				
				src += 2 * m_width;
			}
		}
	}
	else if (m_height & 1)
	{
		nvDebugCheck(m_height == 2 * h + 1);
		
		const float scale = 1.0f / (2 * m_height);
		
		for(uint c = 0; c < m_componentNum; c++)
		{
			const float * src = this->channel(c);
			float * dst = dst_image->channel(c);
			
			for(uint y = 0; y < h; y++)
			{
				const float v0 = float(h - y);
				const float v1 = float(h - 0);
				const float v2 = float(1 + y);
				
				for (uint x = 0; x < w; x++)
				{
					float f = 0.0f;
					f += v0 * (src[0 * m_width + 2 * x] + src[0 * m_width + 2 * x + 1]);
					f += v1 * (src[1 * m_width + 2 * x] + src[1 * m_width + 2 * x + 1]);
					f += v2 * (src[2 * m_width + 2 * x] + src[2 * m_width + 2 * x + 1]);
					
					*dst = f * scale;
					dst++;
				}
				
				src += 2 * m_width;
			}
		}
	}
	
	return dst_image.release();
}